

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

int __thiscall PClass::FindVirtualIndex(PClass *this,FName *name,PPrototype *proto)

{
  PPrototype *pPVar1;
  PType *pPVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  VMFunction **ppVVar6;
  PType **ppPVar7;
  uint local_44;
  uint local_40;
  uint a_1;
  uint a;
  bool fail;
  PPrototype *vproto;
  uint i;
  PPrototype *proto_local;
  FName *name_local;
  PClass *this_local;
  
  vproto._4_4_ = 0;
  do {
    uVar4 = TArray<VMFunction_*,_VMFunction_*>::Size(&this->Virtuals);
    if (uVar4 <= vproto._4_4_) {
      return -1;
    }
    ppVVar6 = TArray<VMFunction_*,_VMFunction_*>::operator[](&this->Virtuals,(ulong)vproto._4_4_);
    bVar3 = FName::operator==(&(*ppVVar6)->Name,name);
    if (bVar3) {
      ppVVar6 = TArray<VMFunction_*,_VMFunction_*>::operator[](&this->Virtuals,(ulong)vproto._4_4_);
      pPVar1 = (*ppVVar6)->Proto;
      uVar4 = TArray<PType_*,_PType_*>::Size(&pPVar1->ReturnTypes);
      uVar5 = TArray<PType_*,_PType_*>::Size(&proto->ReturnTypes);
      if (uVar4 == uVar5) {
        uVar4 = TArray<PType_*,_PType_*>::Size(&pPVar1->ArgumentTypes);
        uVar5 = TArray<PType_*,_PType_*>::Size(&proto->ArgumentTypes);
        if (uVar4 == uVar5) {
          bVar3 = false;
          for (local_40 = 1; uVar4 = TArray<PType_*,_PType_*>::Size(&proto->ArgumentTypes),
              local_40 < uVar4; local_40 = local_40 + 1) {
            ppPVar7 = TArray<PType_*,_PType_*>::operator[](&proto->ArgumentTypes,(ulong)local_40);
            pPVar2 = *ppPVar7;
            ppPVar7 = TArray<PType_*,_PType_*>::operator[](&pPVar1->ArgumentTypes,(ulong)local_40);
            if (pPVar2 != *ppPVar7) {
              bVar3 = true;
              break;
            }
          }
          if (!bVar3) {
            for (local_44 = 0; uVar4 = TArray<PType_*,_PType_*>::Size(&proto->ReturnTypes),
                local_44 < uVar4; local_44 = local_44 + 1) {
              ppPVar7 = TArray<PType_*,_PType_*>::operator[](&proto->ReturnTypes,(ulong)local_44);
              pPVar2 = *ppPVar7;
              ppPVar7 = TArray<PType_*,_PType_*>::operator[](&pPVar1->ReturnTypes,(ulong)local_44);
              if (pPVar2 != *ppPVar7) {
                bVar3 = true;
                break;
              }
            }
            if (!bVar3) {
              return vproto._4_4_;
            }
          }
        }
      }
    }
    vproto._4_4_ = vproto._4_4_ + 1;
  } while( true );
}

Assistant:

int PClass::FindVirtualIndex(FName name, PPrototype *proto)
{
	for (unsigned i = 0; i < Virtuals.Size(); i++)
	{
		if (Virtuals[i]->Name == name)
		{
			auto vproto = Virtuals[i]->Proto;
			if (vproto->ReturnTypes.Size() != proto->ReturnTypes.Size() ||
				vproto->ArgumentTypes.Size() != proto->ArgumentTypes.Size())
			{
				continue;	// number of parameters does not match, so it's incompatible
			}
			bool fail = false;
			// The first argument is self and will mismatch so just skip it.
			for (unsigned a = 1; a < proto->ArgumentTypes.Size(); a++)
			{
				if (proto->ArgumentTypes[a] != vproto->ArgumentTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (fail) continue;

			for (unsigned a = 0; a < proto->ReturnTypes.Size(); a++)
			{
				if (proto->ReturnTypes[a] != vproto->ReturnTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (!fail) return i;
		}
	}
	return -1;
}